

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Zeroes::forward_impl
          (Zeroes *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  void *__s;
  uint uVar1;
  size_type sVar2;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Dim *in_RDI;
  
  sVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar2 == 0) {
    __s = *(void **)(in_RDX + 0x28);
    uVar1 = Dim::size(in_RDI);
    memset(__s,0,(ulong)uVar1 << 2);
    return;
  }
  __assert_fail("xs.size() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x745,
                "virtual void cnn::Zeroes::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void Zeroes::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 0);
#if HAVE_CUDA
  cudaMemsetAsync(fx.v, 0, dim.size() * sizeof(float));
#else
  memset(fx.v, 0, dim.size() * sizeof(float));
#endif
}